

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack16.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_input_pack16_avx512
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  long lVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 (*pauVar59) [64];
  undefined1 (*pauVar60) [64];
  undefined1 (*pauVar61) [64];
  undefined1 (*pauVar62) [64];
  long lVar63;
  long lVar64;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  __m512 _r0tm5;
  __m512 _r0tm4;
  __m512 _r0tm3;
  __m512 _r0tm2;
  __m512 _r0tm1;
  __m512 _r0tm0;
  __m512 _tmp05;
  __m512 _tmp04;
  __m512 _tmp03;
  __m512 _tmp02;
  __m512 _tmp01;
  __m512 _tmp00;
  int m_3;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m512 _tmp5m;
  __m512 _tmp4m;
  __m512 _tmp3m;
  __m512 _tmp2m;
  __m512 _tmp1m;
  __m512 _tmp0m;
  __m512 _r05;
  __m512 _r04;
  __m512 _r03;
  __m512 _r02;
  __m512 _r01;
  __m512 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [6] [6] [16];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 uStack_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 uStack_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 uStack_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 uStack_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  int local_31f4;
  undefined8 *local_31f0;
  undefined8 *local_31e8;
  undefined8 *local_31e0;
  undefined8 *local_31d8;
  undefined8 *local_31d0;
  undefined8 *local_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 uStack_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 uStack_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 uStack_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 uStack_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 uStack_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 uStack_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  int local_2e94;
  undefined1 (*local_2e90) [64];
  int local_2e88;
  int local_2e84;
  undefined8 local_2e80 [312];
  int local_24bc;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  lVar55 = in_RDI[7];
  iVar56 = (iVar1 + -2) / 4;
  iVar57 = ((int)in_RDI[6] + -2) / 4;
  iVar58 = iVar56 * iVar57;
  for (local_24bc = 0; local_24bc < (int)lVar55; local_24bc = local_24bc + 1) {
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    lVar6 = in_RDI[2];
    lVar7 = *in_RSI;
    lVar8 = in_RSI[8];
    lVar9 = in_RSI[2];
    for (local_2e84 = 0; local_2e84 < iVar57; local_2e84 = local_2e84 + 1) {
      for (local_2e88 = 0; local_2e88 < iVar56; local_2e88 = local_2e88 + 1) {
        local_2e90 = (undefined1 (*) [64])
                     (lVar3 + lVar4 * local_24bc * lVar5 +
                      (long)iVar2 * (long)(local_2e84 << 2) * lVar6 + (long)(local_2e88 << 6) * 4);
        for (local_2e94 = 0; local_2e94 < 6; local_2e94 = local_2e94 + 1) {
          pauVar59 = local_2e90 + 1;
          pauVar60 = local_2e90 + 2;
          pauVar61 = local_2e90 + 3;
          pauVar62 = local_2e90 + 4;
          auVar65 = vbroadcastss_avx512f(ZEXT416(0xc0a00000));
          auVar66 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar66 = vfmadd213ps_avx512f(*local_2e90,auVar66,*pauVar62);
          auVar65 = vfmadd213ps_avx512f(*pauVar60,auVar65,auVar66);
          auVar66 = vbroadcastss_avx512f(ZEXT416(0xc0800000));
          auVar67 = vaddps_avx512f(*pauVar59,*pauVar60);
          auVar68 = vaddps_avx512f(*pauVar62,*pauVar61);
          auVar66 = vfmadd213ps_avx512f(auVar67,auVar66,auVar68);
          auVar67 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar68 = vsubps_avx512f(*pauVar59,*pauVar60);
          auVar69 = vsubps_avx512f(*pauVar62,*pauVar61);
          auVar67 = vfmadd213ps_avx512f(auVar68,auVar67,auVar69);
          auVar68 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
          auVar69 = vsubps_avx512f(*pauVar59,*pauVar61);
          auVar70 = vsubps_avx512f(*pauVar62,*pauVar60);
          auVar68 = vfmadd213ps_avx512f(auVar69,auVar68,auVar70);
          auVar69 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar70 = vsubps_avx512f(*pauVar59,*pauVar61);
          auVar71 = vsubps_avx512f(*pauVar62,*pauVar60);
          auVar69 = vfmadd213ps_avx512f(auVar70,auVar69,auVar71);
          auVar70 = vbroadcastss_avx512f(ZEXT416(0xc0a00000));
          auVar71 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar71 = vfmadd213ps_avx512f(*pauVar59,auVar71,local_2e90[5]);
          auVar70 = vfmadd213ps_avx512f(*pauVar61,auVar70,auVar71);
          lVar64 = (long)local_2e94;
          local_3080 = auVar65._0_8_;
          uStack_3078 = auVar65._8_8_;
          uStack_3070 = auVar65._16_8_;
          uStack_3068 = auVar65._24_8_;
          uStack_3060 = auVar65._32_8_;
          uStack_3058 = auVar65._40_8_;
          uStack_3050 = auVar65._48_8_;
          uStack_3048 = auVar65._56_8_;
          local_2e80[lVar64 * 8] = local_3080;
          local_2e80[lVar64 * 8 + 1] = uStack_3078;
          local_2e80[lVar64 * 8 + 2] = uStack_3070;
          local_2e80[lVar64 * 8 + 3] = uStack_3068;
          local_2e80[lVar64 * 8 + 4] = uStack_3060;
          local_2e80[lVar64 * 8 + 5] = uStack_3058;
          local_2e80[lVar64 * 8 + 6] = uStack_3050;
          local_2e80[lVar64 * 8 + 7] = uStack_3048;
          lVar64 = (long)local_2e94;
          local_30c0 = auVar66._0_8_;
          uStack_30b8 = auVar66._8_8_;
          uStack_30b0 = auVar66._16_8_;
          uStack_30a8 = auVar66._24_8_;
          uStack_30a0 = auVar66._32_8_;
          uStack_3098 = auVar66._40_8_;
          uStack_3090 = auVar66._48_8_;
          uStack_3088 = auVar66._56_8_;
          local_2e80[lVar64 * 8 + 0x30] = local_30c0;
          local_2e80[lVar64 * 8 + 0x31] = uStack_30b8;
          local_2e80[lVar64 * 8 + 0x32] = uStack_30b0;
          local_2e80[lVar64 * 8 + 0x33] = uStack_30a8;
          local_2e80[lVar64 * 8 + 0x34] = uStack_30a0;
          local_2e80[lVar64 * 8 + 0x35] = uStack_3098;
          local_2e80[lVar64 * 8 + 0x36] = uStack_3090;
          local_2e80[lVar64 * 8 + 0x37] = uStack_3088;
          lVar64 = (long)local_2e94;
          local_3100 = auVar67._0_8_;
          uStack_30f8 = auVar67._8_8_;
          uStack_30f0 = auVar67._16_8_;
          uStack_30e8 = auVar67._24_8_;
          uStack_30e0 = auVar67._32_8_;
          uStack_30d8 = auVar67._40_8_;
          uStack_30d0 = auVar67._48_8_;
          uStack_30c8 = auVar67._56_8_;
          local_2e80[lVar64 * 8 + 0x60] = local_3100;
          local_2e80[lVar64 * 8 + 0x61] = uStack_30f8;
          local_2e80[lVar64 * 8 + 0x62] = uStack_30f0;
          local_2e80[lVar64 * 8 + 99] = uStack_30e8;
          local_2e80[lVar64 * 8 + 100] = uStack_30e0;
          local_2e80[lVar64 * 8 + 0x65] = uStack_30d8;
          local_2e80[lVar64 * 8 + 0x66] = uStack_30d0;
          local_2e80[lVar64 * 8 + 0x67] = uStack_30c8;
          lVar64 = (long)local_2e94;
          local_3140 = auVar68._0_8_;
          uStack_3138 = auVar68._8_8_;
          uStack_3130 = auVar68._16_8_;
          uStack_3128 = auVar68._24_8_;
          uStack_3120 = auVar68._32_8_;
          uStack_3118 = auVar68._40_8_;
          uStack_3110 = auVar68._48_8_;
          uStack_3108 = auVar68._56_8_;
          local_2e80[lVar64 * 8 + 0x90] = local_3140;
          local_2e80[lVar64 * 8 + 0x91] = uStack_3138;
          local_2e80[lVar64 * 8 + 0x92] = uStack_3130;
          local_2e80[lVar64 * 8 + 0x93] = uStack_3128;
          local_2e80[lVar64 * 8 + 0x94] = uStack_3120;
          local_2e80[lVar64 * 8 + 0x95] = uStack_3118;
          local_2e80[lVar64 * 8 + 0x96] = uStack_3110;
          local_2e80[lVar64 * 8 + 0x97] = uStack_3108;
          lVar64 = (long)local_2e94;
          local_3180 = auVar69._0_8_;
          uStack_3178 = auVar69._8_8_;
          uStack_3170 = auVar69._16_8_;
          uStack_3168 = auVar69._24_8_;
          uStack_3160 = auVar69._32_8_;
          uStack_3158 = auVar69._40_8_;
          uStack_3150 = auVar69._48_8_;
          uStack_3148 = auVar69._56_8_;
          local_2e80[lVar64 * 8 + 0xc0] = local_3180;
          local_2e80[lVar64 * 8 + 0xc1] = uStack_3178;
          local_2e80[lVar64 * 8 + 0xc2] = uStack_3170;
          local_2e80[lVar64 * 8 + 0xc3] = uStack_3168;
          local_2e80[lVar64 * 8 + 0xc4] = uStack_3160;
          local_2e80[lVar64 * 8 + 0xc5] = uStack_3158;
          local_2e80[lVar64 * 8 + 0xc6] = uStack_3150;
          local_2e80[lVar64 * 8 + 199] = uStack_3148;
          lVar64 = (long)local_2e94;
          local_31c0 = auVar70._0_8_;
          uStack_31b8 = auVar70._8_8_;
          uStack_31b0 = auVar70._16_8_;
          uStack_31a8 = auVar70._24_8_;
          uStack_31a0 = auVar70._32_8_;
          uStack_3198 = auVar70._40_8_;
          uStack_3190 = auVar70._48_8_;
          uStack_3188 = auVar70._56_8_;
          local_2e80[lVar64 * 8 + 0xf0] = local_31c0;
          local_2e80[lVar64 * 8 + 0xf1] = uStack_31b8;
          local_2e80[lVar64 * 8 + 0xf2] = uStack_31b0;
          local_2e80[lVar64 * 8 + 0xf3] = uStack_31a8;
          local_2e80[lVar64 * 8 + 0xf4] = uStack_31a0;
          local_2e80[lVar64 * 8 + 0xf5] = uStack_3198;
          local_2e80[lVar64 * 8 + 0xf6] = uStack_3190;
          local_2e80[lVar64 * 8 + 0xf7] = uStack_3188;
          local_2e90 = (undefined1 (*) [64])(*local_2e90 + (long)(iVar1 << 4) * 4);
        }
        local_31c8 = (undefined8 *)
                     (lVar7 + lVar8 * local_24bc * lVar9 +
                     (long)((local_2e84 * iVar56 + local_2e88) * 0x10) * 4);
        local_31d0 = (undefined8 *)((long)local_31c8 + (long)(iVar58 * 0x10) * 4);
        local_31d8 = (undefined8 *)((long)local_31c8 + (long)(iVar58 * 0x20) * 4);
        local_31e0 = (undefined8 *)((long)local_31c8 + (long)(iVar58 * 0x30) * 4);
        local_31e8 = (undefined8 *)((long)local_31c8 + (long)(iVar58 * 0x40) * 4);
        local_31f0 = (undefined8 *)((long)local_31c8 + (long)(iVar58 * 0x50) * 4);
        for (local_31f4 = 0; local_31f4 < 6; local_31f4 = local_31f4 + 1) {
          lVar64 = (long)local_31f4;
          lVar63 = (long)local_31f4;
          uVar10 = local_2e80[lVar63 * 0x30 + 8];
          uVar11 = local_2e80[lVar63 * 0x30 + 9];
          uVar12 = local_2e80[lVar63 * 0x30 + 10];
          uVar13 = local_2e80[lVar63 * 0x30 + 0xb];
          uVar14 = local_2e80[lVar63 * 0x30 + 0xc];
          uVar15 = local_2e80[lVar63 * 0x30 + 0xd];
          uVar16 = local_2e80[lVar63 * 0x30 + 0xe];
          uVar17 = local_2e80[lVar63 * 0x30 + 0xf];
          lVar63 = (long)local_31f4;
          uVar18 = local_2e80[lVar63 * 0x30 + 0x10];
          uVar19 = local_2e80[lVar63 * 0x30 + 0x11];
          uVar20 = local_2e80[lVar63 * 0x30 + 0x12];
          uVar21 = local_2e80[lVar63 * 0x30 + 0x13];
          uVar22 = local_2e80[lVar63 * 0x30 + 0x14];
          uVar23 = local_2e80[lVar63 * 0x30 + 0x15];
          uVar24 = local_2e80[lVar63 * 0x30 + 0x16];
          uVar25 = local_2e80[lVar63 * 0x30 + 0x17];
          lVar63 = (long)local_31f4;
          uVar26 = local_2e80[lVar63 * 0x30 + 0x18];
          uVar27 = local_2e80[lVar63 * 0x30 + 0x19];
          uVar28 = local_2e80[lVar63 * 0x30 + 0x1a];
          uVar29 = local_2e80[lVar63 * 0x30 + 0x1b];
          uVar30 = local_2e80[lVar63 * 0x30 + 0x1c];
          uVar31 = local_2e80[lVar63 * 0x30 + 0x1d];
          uVar32 = local_2e80[lVar63 * 0x30 + 0x1e];
          uVar33 = local_2e80[lVar63 * 0x30 + 0x1f];
          lVar63 = (long)local_31f4;
          uVar34 = local_2e80[lVar63 * 0x30 + 0x20];
          uVar35 = local_2e80[lVar63 * 0x30 + 0x21];
          uVar36 = local_2e80[lVar63 * 0x30 + 0x22];
          uVar37 = local_2e80[lVar63 * 0x30 + 0x23];
          uVar38 = local_2e80[lVar63 * 0x30 + 0x24];
          uVar39 = local_2e80[lVar63 * 0x30 + 0x25];
          uVar40 = local_2e80[lVar63 * 0x30 + 0x26];
          uVar41 = local_2e80[lVar63 * 0x30 + 0x27];
          lVar63 = (long)local_31f4;
          auVar65 = vbroadcastss_avx512f(ZEXT416(0xc0a00000));
          auVar66 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar70._8_8_ = local_2e80[lVar64 * 0x30 + 1];
          auVar70._0_8_ = local_2e80[lVar64 * 0x30];
          auVar70._16_8_ = local_2e80[lVar64 * 0x30 + 2];
          auVar70._24_8_ = local_2e80[lVar64 * 0x30 + 3];
          auVar70._32_8_ = local_2e80[lVar64 * 0x30 + 4];
          auVar70._40_8_ = local_2e80[lVar64 * 0x30 + 5];
          auVar70._48_8_ = local_2e80[lVar64 * 0x30 + 6];
          auVar70._56_8_ = local_2e80[lVar64 * 0x30 + 7];
          auVar69._8_8_ = uVar35;
          auVar69._0_8_ = uVar34;
          auVar69._16_8_ = uVar36;
          auVar69._24_8_ = uVar37;
          auVar69._32_8_ = uVar38;
          auVar69._40_8_ = uVar39;
          auVar69._48_8_ = uVar40;
          auVar69._56_8_ = uVar41;
          auVar66 = vfmadd213ps_avx512f(auVar70,auVar66,auVar69);
          auVar68._8_8_ = uVar19;
          auVar68._0_8_ = uVar18;
          auVar68._16_8_ = uVar20;
          auVar68._24_8_ = uVar21;
          auVar68._32_8_ = uVar22;
          auVar68._40_8_ = uVar23;
          auVar68._48_8_ = uVar24;
          auVar68._56_8_ = uVar25;
          auVar68 = vfmadd213ps_avx512f(auVar68,auVar65,auVar66);
          auVar65 = vbroadcastss_avx512f(ZEXT416(0xc0800000));
          auVar54._8_8_ = uVar11;
          auVar54._0_8_ = uVar10;
          auVar54._16_8_ = uVar12;
          auVar54._24_8_ = uVar13;
          auVar54._32_8_ = uVar14;
          auVar54._40_8_ = uVar15;
          auVar54._48_8_ = uVar16;
          auVar54._56_8_ = uVar17;
          auVar53._8_8_ = uVar19;
          auVar53._0_8_ = uVar18;
          auVar53._16_8_ = uVar20;
          auVar53._24_8_ = uVar21;
          auVar53._32_8_ = uVar22;
          auVar53._40_8_ = uVar23;
          auVar53._48_8_ = uVar24;
          auVar53._56_8_ = uVar25;
          auVar66 = vaddps_avx512f(auVar54,auVar53);
          auVar52._8_8_ = uVar35;
          auVar52._0_8_ = uVar34;
          auVar52._16_8_ = uVar36;
          auVar52._24_8_ = uVar37;
          auVar52._32_8_ = uVar38;
          auVar52._40_8_ = uVar39;
          auVar52._48_8_ = uVar40;
          auVar52._56_8_ = uVar41;
          auVar51._8_8_ = uVar27;
          auVar51._0_8_ = uVar26;
          auVar51._16_8_ = uVar28;
          auVar51._24_8_ = uVar29;
          auVar51._32_8_ = uVar30;
          auVar51._40_8_ = uVar31;
          auVar51._48_8_ = uVar32;
          auVar51._56_8_ = uVar33;
          auVar67 = vaddps_avx512f(auVar52,auVar51);
          auVar69 = vfmadd213ps_avx512f(auVar66,auVar65,auVar67);
          auVar65 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar50._8_8_ = uVar11;
          auVar50._0_8_ = uVar10;
          auVar50._16_8_ = uVar12;
          auVar50._24_8_ = uVar13;
          auVar50._32_8_ = uVar14;
          auVar50._40_8_ = uVar15;
          auVar50._48_8_ = uVar16;
          auVar50._56_8_ = uVar17;
          auVar49._8_8_ = uVar19;
          auVar49._0_8_ = uVar18;
          auVar49._16_8_ = uVar20;
          auVar49._24_8_ = uVar21;
          auVar49._32_8_ = uVar22;
          auVar49._40_8_ = uVar23;
          auVar49._48_8_ = uVar24;
          auVar49._56_8_ = uVar25;
          auVar66 = vsubps_avx512f(auVar50,auVar49);
          auVar48._8_8_ = uVar35;
          auVar48._0_8_ = uVar34;
          auVar48._16_8_ = uVar36;
          auVar48._24_8_ = uVar37;
          auVar48._32_8_ = uVar38;
          auVar48._40_8_ = uVar39;
          auVar48._48_8_ = uVar40;
          auVar48._56_8_ = uVar41;
          auVar47._8_8_ = uVar27;
          auVar47._0_8_ = uVar26;
          auVar47._16_8_ = uVar28;
          auVar47._24_8_ = uVar29;
          auVar47._32_8_ = uVar30;
          auVar47._40_8_ = uVar31;
          auVar47._48_8_ = uVar32;
          auVar47._56_8_ = uVar33;
          auVar67 = vsubps_avx512f(auVar48,auVar47);
          auVar70 = vfmadd213ps_avx512f(auVar66,auVar65,auVar67);
          auVar65 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
          auVar46._8_8_ = uVar11;
          auVar46._0_8_ = uVar10;
          auVar46._16_8_ = uVar12;
          auVar46._24_8_ = uVar13;
          auVar46._32_8_ = uVar14;
          auVar46._40_8_ = uVar15;
          auVar46._48_8_ = uVar16;
          auVar46._56_8_ = uVar17;
          auVar45._8_8_ = uVar27;
          auVar45._0_8_ = uVar26;
          auVar45._16_8_ = uVar28;
          auVar45._24_8_ = uVar29;
          auVar45._32_8_ = uVar30;
          auVar45._40_8_ = uVar31;
          auVar45._48_8_ = uVar32;
          auVar45._56_8_ = uVar33;
          auVar66 = vsubps_avx512f(auVar46,auVar45);
          auVar44._8_8_ = uVar35;
          auVar44._0_8_ = uVar34;
          auVar44._16_8_ = uVar36;
          auVar44._24_8_ = uVar37;
          auVar44._32_8_ = uVar38;
          auVar44._40_8_ = uVar39;
          auVar44._48_8_ = uVar40;
          auVar44._56_8_ = uVar41;
          auVar72._8_8_ = uVar19;
          auVar72._0_8_ = uVar18;
          auVar72._16_8_ = uVar20;
          auVar72._24_8_ = uVar21;
          auVar72._32_8_ = uVar22;
          auVar72._40_8_ = uVar23;
          auVar72._48_8_ = uVar24;
          auVar72._56_8_ = uVar25;
          auVar67 = vsubps_avx512f(auVar44,auVar72);
          auVar72 = vfmadd213ps_avx512f(auVar66,auVar65,auVar67);
          auVar65 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar43._8_8_ = uVar11;
          auVar43._0_8_ = uVar10;
          auVar43._16_8_ = uVar12;
          auVar43._24_8_ = uVar13;
          auVar43._32_8_ = uVar14;
          auVar43._40_8_ = uVar15;
          auVar43._48_8_ = uVar16;
          auVar43._56_8_ = uVar17;
          auVar42._8_8_ = uVar27;
          auVar42._0_8_ = uVar26;
          auVar42._16_8_ = uVar28;
          auVar42._24_8_ = uVar29;
          auVar42._32_8_ = uVar30;
          auVar42._40_8_ = uVar31;
          auVar42._48_8_ = uVar32;
          auVar42._56_8_ = uVar33;
          auVar66 = vsubps_avx512f(auVar43,auVar42);
          auVar73._8_8_ = uVar35;
          auVar73._0_8_ = uVar34;
          auVar73._16_8_ = uVar36;
          auVar73._24_8_ = uVar37;
          auVar73._32_8_ = uVar38;
          auVar73._40_8_ = uVar39;
          auVar73._48_8_ = uVar40;
          auVar73._56_8_ = uVar41;
          auVar71._8_8_ = uVar19;
          auVar71._0_8_ = uVar18;
          auVar71._16_8_ = uVar20;
          auVar71._24_8_ = uVar21;
          auVar71._32_8_ = uVar22;
          auVar71._40_8_ = uVar23;
          auVar71._48_8_ = uVar24;
          auVar71._56_8_ = uVar25;
          auVar67 = vsubps_avx512f(auVar73,auVar71);
          auVar71 = vfmadd213ps_avx512f(auVar66,auVar65,auVar67);
          auVar73 = vbroadcastss_avx512f(ZEXT416(0xc0a00000));
          auVar65 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar67._8_8_ = uVar11;
          auVar67._0_8_ = uVar10;
          auVar67._16_8_ = uVar12;
          auVar67._24_8_ = uVar13;
          auVar67._32_8_ = uVar14;
          auVar67._40_8_ = uVar15;
          auVar67._48_8_ = uVar16;
          auVar67._56_8_ = uVar17;
          auVar66._8_8_ = local_2e80[lVar63 * 0x30 + 0x29];
          auVar66._0_8_ = local_2e80[lVar63 * 0x30 + 0x28];
          auVar66._16_8_ = local_2e80[lVar63 * 0x30 + 0x2a];
          auVar66._24_8_ = local_2e80[lVar63 * 0x30 + 0x2b];
          auVar66._32_8_ = local_2e80[lVar63 * 0x30 + 0x2c];
          auVar66._40_8_ = local_2e80[lVar63 * 0x30 + 0x2d];
          auVar66._48_8_ = local_2e80[lVar63 * 0x30 + 0x2e];
          auVar66._56_8_ = local_2e80[lVar63 * 0x30 + 0x2f];
          auVar66 = vfmadd213ps_avx512f(auVar67,auVar65,auVar66);
          auVar65._8_8_ = uVar27;
          auVar65._0_8_ = uVar26;
          auVar65._16_8_ = uVar28;
          auVar65._24_8_ = uVar29;
          auVar65._32_8_ = uVar30;
          auVar65._40_8_ = uVar31;
          auVar65._48_8_ = uVar32;
          auVar65._56_8_ = uVar33;
          auVar65 = vfmadd213ps_avx512f(auVar65,auVar73,auVar66);
          local_33c0 = auVar68._0_8_;
          uStack_33b8 = auVar68._8_8_;
          uStack_33b0 = auVar68._16_8_;
          uStack_33a8 = auVar68._24_8_;
          uStack_33a0 = auVar68._32_8_;
          uStack_3398 = auVar68._40_8_;
          uStack_3390 = auVar68._48_8_;
          uStack_3388 = auVar68._56_8_;
          *local_31c8 = local_33c0;
          local_31c8[1] = uStack_33b8;
          local_31c8[2] = uStack_33b0;
          local_31c8[3] = uStack_33a8;
          local_31c8[4] = uStack_33a0;
          local_31c8[5] = uStack_3398;
          local_31c8[6] = uStack_3390;
          local_31c8[7] = uStack_3388;
          local_3400 = auVar69._0_8_;
          uStack_33f8 = auVar69._8_8_;
          uStack_33f0 = auVar69._16_8_;
          uStack_33e8 = auVar69._24_8_;
          uStack_33e0 = auVar69._32_8_;
          uStack_33d8 = auVar69._40_8_;
          uStack_33d0 = auVar69._48_8_;
          uStack_33c8 = auVar69._56_8_;
          *local_31d0 = local_3400;
          local_31d0[1] = uStack_33f8;
          local_31d0[2] = uStack_33f0;
          local_31d0[3] = uStack_33e8;
          local_31d0[4] = uStack_33e0;
          local_31d0[5] = uStack_33d8;
          local_31d0[6] = uStack_33d0;
          local_31d0[7] = uStack_33c8;
          local_3440 = auVar70._0_8_;
          uStack_3438 = auVar70._8_8_;
          uStack_3430 = auVar70._16_8_;
          uStack_3428 = auVar70._24_8_;
          uStack_3420 = auVar70._32_8_;
          uStack_3418 = auVar70._40_8_;
          uStack_3410 = auVar70._48_8_;
          uStack_3408 = auVar70._56_8_;
          *local_31d8 = local_3440;
          local_31d8[1] = uStack_3438;
          local_31d8[2] = uStack_3430;
          local_31d8[3] = uStack_3428;
          local_31d8[4] = uStack_3420;
          local_31d8[5] = uStack_3418;
          local_31d8[6] = uStack_3410;
          local_31d8[7] = uStack_3408;
          local_3480 = auVar72._0_8_;
          uStack_3478 = auVar72._8_8_;
          uStack_3470 = auVar72._16_8_;
          uStack_3468 = auVar72._24_8_;
          uStack_3460 = auVar72._32_8_;
          uStack_3458 = auVar72._40_8_;
          uStack_3450 = auVar72._48_8_;
          uStack_3448 = auVar72._56_8_;
          *local_31e0 = local_3480;
          local_31e0[1] = uStack_3478;
          local_31e0[2] = uStack_3470;
          local_31e0[3] = uStack_3468;
          local_31e0[4] = uStack_3460;
          local_31e0[5] = uStack_3458;
          local_31e0[6] = uStack_3450;
          local_31e0[7] = uStack_3448;
          local_34c0 = auVar71._0_8_;
          uStack_34b8 = auVar71._8_8_;
          uStack_34b0 = auVar71._16_8_;
          uStack_34a8 = auVar71._24_8_;
          uStack_34a0 = auVar71._32_8_;
          uStack_3498 = auVar71._40_8_;
          uStack_3490 = auVar71._48_8_;
          uStack_3488 = auVar71._56_8_;
          *local_31e8 = local_34c0;
          local_31e8[1] = uStack_34b8;
          local_31e8[2] = uStack_34b0;
          local_31e8[3] = uStack_34a8;
          local_31e8[4] = uStack_34a0;
          local_31e8[5] = uStack_3498;
          local_31e8[6] = uStack_3490;
          local_31e8[7] = uStack_3488;
          local_3500 = auVar65._0_8_;
          uStack_34f8 = auVar65._8_8_;
          uStack_34f0 = auVar65._16_8_;
          uStack_34e8 = auVar65._24_8_;
          uStack_34e0 = auVar65._32_8_;
          uStack_34d8 = auVar65._40_8_;
          uStack_34d0 = auVar65._48_8_;
          uStack_34c8 = auVar65._56_8_;
          *local_31f0 = local_3500;
          local_31f0[1] = uStack_34f8;
          local_31f0[2] = uStack_34f0;
          local_31f0[3] = uStack_34e8;
          local_31f0[4] = uStack_34e0;
          local_31f0[5] = uStack_34d8;
          local_31f0[6] = uStack_34d0;
          local_31f0[7] = uStack_34c8;
          local_31c8 = (undefined8 *)((long)local_31c8 + (long)(iVar58 * 0x60) * 4);
          local_31d0 = (undefined8 *)((long)local_31d0 + (long)(iVar58 * 0x60) * 4);
          local_31d8 = (undefined8 *)((long)local_31d8 + (long)(iVar58 * 0x60) * 4);
          local_31e0 = (undefined8 *)((long)local_31e0 + (long)(iVar58 * 0x60) * 4);
          local_31e8 = (undefined8 *)((long)local_31e8 + (long)(iVar58 * 0x60) * 4);
          local_31f0 = (undefined8 *)((long)local_31f0 + (long)(iVar58 * 0x60) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_input_pack16_avx512(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 4;
    const int h_tiles = (h - 2) / 4;
    const int tiles = w_tiles * h_tiles;

    // const float itm[4][4] = {
    //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
    //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
    //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
    //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
    // };

    // 0 =  4 * r00 - 5 * r02 + r04
    // 1 = -4 * (r01 + r02) + r04 + r03
    // 2 =  4 * (r01 - r02) + r04 - r03
    // 3 = -2 * (r01 - r03) + r04 - r02
    // 4 =  2 * (r01 - r03) + r04 - r02
    // 5 =  4 * r01 - 5 * r03 + r05

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(64))
#else
        __attribute__((aligned(64)))
#endif
        float tmp[6][6][16];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 4) + (j * 4) * 16;

                for (int m = 0; m < 6; m++)
                {
                    __m512 _r00 = _mm512_load_ps(r0);
                    __m512 _r01 = _mm512_load_ps(r0 + 16);
                    __m512 _r02 = _mm512_load_ps(r0 + 16 * 2);
                    __m512 _r03 = _mm512_load_ps(r0 + 16 * 3);
                    __m512 _r04 = _mm512_load_ps(r0 + 16 * 4);
                    __m512 _r05 = _mm512_load_ps(r0 + 16 * 5);

                    __m512 _tmp0m = _mm512_fmadd_ps(_mm512_set1_ps(-5.f), _r02, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _r00, _r04));
                    __m512 _tmp1m = _mm512_fmadd_ps(_mm512_set1_ps(-4.f), _mm512_add_ps(_r01, _r02), _mm512_add_ps(_r04, _r03));
                    __m512 _tmp2m = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_sub_ps(_r01, _r02), _mm512_sub_ps(_r04, _r03));
                    __m512 _tmp3m = _mm512_fmadd_ps(_mm512_set1_ps(-2.f), _mm512_sub_ps(_r01, _r03), _mm512_sub_ps(_r04, _r02));
                    __m512 _tmp4m = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _mm512_sub_ps(_r01, _r03), _mm512_sub_ps(_r04, _r02));
                    __m512 _tmp5m = _mm512_fmadd_ps(_mm512_set1_ps(-5.f), _r03, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _r01, _r05));

                    _mm512_store_ps(tmp[0][m], _tmp0m);
                    _mm512_store_ps(tmp[1][m], _tmp1m);
                    _mm512_store_ps(tmp[2][m], _tmp2m);
                    _mm512_store_ps(tmp[3][m], _tmp3m);
                    _mm512_store_ps(tmp[4][m], _tmp4m);
                    _mm512_store_ps(tmp[5][m], _tmp5m);

                    r0 += w * 16;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 16;
                float* r0_tm_1 = r0_tm_0 + tiles * 16;
                float* r0_tm_2 = r0_tm_0 + tiles * 16 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 16 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 16 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 16 * 5;

                for (int m = 0; m < 6; m++)
                {
                    __m512 _tmp00 = _mm512_load_ps(tmp[m][0]);
                    __m512 _tmp01 = _mm512_load_ps(tmp[m][1]);
                    __m512 _tmp02 = _mm512_load_ps(tmp[m][2]);
                    __m512 _tmp03 = _mm512_load_ps(tmp[m][3]);
                    __m512 _tmp04 = _mm512_load_ps(tmp[m][4]);
                    __m512 _tmp05 = _mm512_load_ps(tmp[m][5]);

                    __m512 _r0tm0 = _mm512_fmadd_ps(_mm512_set1_ps(-5.f), _tmp02, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _tmp00, _tmp04));
                    __m512 _r0tm1 = _mm512_fmadd_ps(_mm512_set1_ps(-4.f), _mm512_add_ps(_tmp01, _tmp02), _mm512_add_ps(_tmp04, _tmp03));
                    __m512 _r0tm2 = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_sub_ps(_tmp01, _tmp02), _mm512_sub_ps(_tmp04, _tmp03));
                    __m512 _r0tm3 = _mm512_fmadd_ps(_mm512_set1_ps(-2.f), _mm512_sub_ps(_tmp01, _tmp03), _mm512_sub_ps(_tmp04, _tmp02));
                    __m512 _r0tm4 = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _mm512_sub_ps(_tmp01, _tmp03), _mm512_sub_ps(_tmp04, _tmp02));
                    __m512 _r0tm5 = _mm512_fmadd_ps(_mm512_set1_ps(-5.f), _tmp03, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _tmp01, _tmp05));

                    _mm512_store_ps(r0_tm_0, _r0tm0);
                    _mm512_store_ps(r0_tm_1, _r0tm1);
                    _mm512_store_ps(r0_tm_2, _r0tm2);
                    _mm512_store_ps(r0_tm_3, _r0tm3);
                    _mm512_store_ps(r0_tm_4, _r0tm4);
                    _mm512_store_ps(r0_tm_5, _r0tm5);

                    r0_tm_0 += tiles * 96;
                    r0_tm_1 += tiles * 96;
                    r0_tm_2 += tiles * 96;
                    r0_tm_3 += tiles * 96;
                    r0_tm_4 += tiles * 96;
                    r0_tm_5 += tiles * 96;
                }
            }
        }
    }
}